

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode rtsp_rtp_readwrite(Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *readmore)

{
  anon_union_224_10_26c073a1_for_proto *paVar1;
  int *piVar2;
  char **ppcVar3;
  Curl_easy *data_00;
  void *pvVar4;
  anon_union_224_10_26c073a1_for_proto *paVar5;
  curl_write_callback p_Var6;
  size_t sVar7;
  ulong __n;
  ulong uVar8;
  char *pcVar9;
  
  paVar1 = &conn->proto;
  if ((conn->proto).generic == (void *)0x0) {
    paVar5 = (anon_union_224_10_26c073a1_for_proto *)&(data->req).str;
    __n = *nread;
  }
  else {
    pvVar4 = Curl_saferealloc((conn->proto).generic,*nread + (conn->proto).ftpc.pp.cache_size);
    if (pvVar4 == (void *)0x0) {
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->proto).generic = pvVar4;
    memcpy((void *)((long)pvVar4 + (conn->proto).ftpc.pp.cache_size),(data->req).str,*nread);
    __n = (conn->proto).ftpc.pp.cache_size + *nread;
    (conn->proto).ftpc.pp.cache_size = __n;
    paVar5 = paVar1;
  }
  pcVar9 = (paVar5->ftpc).pp.cache;
  do {
    if ((long)__n < 1) {
      if (__n == 0) {
        __n = 0;
      }
      else {
LAB_00138f69:
        if (*pcVar9 == '$') {
          pvVar4 = (*Curl_cmalloc)(__n);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar4,pcVar9,__n);
            (*Curl_cfree)((conn->proto).ftpc.pp.cache);
            (conn->proto).generic = pvVar4;
            (conn->proto).ftpc.pp.cache_size = __n;
            *nread = 0;
            return CURLE_OK;
          }
          (*Curl_cfree)((paVar1->ftpc).pp.cache);
          (paVar1->ftpc).pp.cache = (char *)0x0;
          (conn->proto).ftpc.pp.cache_size = 0;
          return CURLE_OUT_OF_MEMORY;
        }
      }
LAB_00138fc2:
      ppcVar3 = &(data->req).str;
      *ppcVar3 = *ppcVar3 + (*nread - __n);
      *nread = __n;
      (*Curl_cfree)((paVar1->ftpc).pp.cache);
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CURLE_OK;
    }
    if (*pcVar9 != '$') goto LAB_00138fc2;
    if (__n < 5) {
LAB_00138f61:
      *readmore = true;
      goto LAB_00138f69;
    }
    *(uint *)((long)&conn->proto + 0x10) = (uint)(byte)pcVar9[1];
    uVar8 = (ulong)(ushort)(*(ushort *)(pcVar9 + 2) << 8 | *(ushort *)(pcVar9 + 2) >> 8) + 4;
    if (__n < uVar8) goto LAB_00138f61;
    data_00 = conn->data;
    p_Var6 = (data_00->set).fwrite_rtp;
    if (p_Var6 == (curl_write_callback)0x0) {
      p_Var6 = (data_00->set).fwrite_func;
    }
    sVar7 = (*p_Var6)(pcVar9,1,uVar8,(data_00->set).rtp_out);
    if (sVar7 == 0x10000001) {
      pcVar9 = "Cannot pause RTP";
LAB_00139001:
      Curl_failf(data_00,pcVar9);
      Curl_failf(data,"Got an error writing an RTP packet");
      *readmore = false;
      (*Curl_cfree)((paVar1->ftpc).pp.cache);
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CURLE_WRITE_ERROR;
    }
    if (sVar7 != uVar8) {
      pcVar9 = "Failed writing RTP data";
      goto LAB_00139001;
    }
    if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
    }
    pcVar9 = pcVar9 + uVar8;
    __n = __n - uVar8;
  } while( true );
}

Assistant:

static CURLcode rtsp_rtp_readwrite(struct Curl_easy *data,
                                   struct connectdata *conn,
                                   ssize_t *nread,
                                   bool *readmore) {
  struct SingleRequest *k = &data->req;
  struct rtsp_conn *rtspc = &(conn->proto.rtspc);

  char *rtp; /* moving pointer to rtp data */
  ssize_t rtp_dataleft; /* how much data left to parse in this round */
  char *scratch;
  CURLcode result;

  if(rtspc->rtp_buf) {
    /* There was some leftover data the last time. Merge buffers */
    char *newptr = Curl_saferealloc(rtspc->rtp_buf,
                                    rtspc->rtp_bufsize + *nread);
    if(!newptr) {
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    rtspc->rtp_buf = newptr;
    memcpy(rtspc->rtp_buf + rtspc->rtp_bufsize, k->str, *nread);
    rtspc->rtp_bufsize += *nread;
    rtp = rtspc->rtp_buf;
    rtp_dataleft = rtspc->rtp_bufsize;
  }
  else {
    /* Just parse the request buffer directly */
    rtp = k->str;
    rtp_dataleft = *nread;
  }

  while((rtp_dataleft > 0) &&
        (rtp[0] == '$')) {
    if(rtp_dataleft > 4) {
      int rtp_length;

      /* Parse the header */
      /* The channel identifier immediately follows and is 1 byte */
      rtspc->rtp_channel = RTP_PKT_CHANNEL(rtp);

      /* The length is two bytes */
      rtp_length = RTP_PKT_LENGTH(rtp);

      if(rtp_dataleft < rtp_length + 4) {
        /* Need more - incomplete payload*/
        *readmore = TRUE;
        break;
      }
      else {
        /* We have the full RTP interleaved packet
         * Write out the header including the leading '$' */
        DEBUGF(infof(data, "RTP write channel %d rtp_length %d\n",
              rtspc->rtp_channel, rtp_length));
        result = rtp_client_write(conn, &rtp[0], rtp_length + 4);
        if(result) {
          failf(data, "Got an error writing an RTP packet");
          *readmore = FALSE;
          Curl_safefree(rtspc->rtp_buf);
          rtspc->rtp_buf = NULL;
          rtspc->rtp_bufsize = 0;
          return result;
        }

        /* Move forward in the buffer */
        rtp_dataleft -= rtp_length + 4;
        rtp += rtp_length + 4;

        if(data->set.rtspreq == RTSPREQ_RECEIVE) {
          /* If we are in a passive receive, give control back
           * to the app as often as we can.
           */
          k->keepon &= ~KEEP_RECV;
        }
      }
    }
    else {
      /* Need more - incomplete header */
      *readmore = TRUE;
      break;
    }
  }

  if(rtp_dataleft != 0 && rtp[0] == '$') {
    DEBUGF(infof(data, "RTP Rewinding %zd %s\n", rtp_dataleft,
          *readmore ? "(READMORE)" : ""));

    /* Store the incomplete RTP packet for a "rewind" */
    scratch = malloc(rtp_dataleft);
    if(!scratch) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(scratch, rtp, rtp_dataleft);
    Curl_safefree(rtspc->rtp_buf);
    rtspc->rtp_buf = scratch;
    rtspc->rtp_bufsize = rtp_dataleft;

    /* As far as the transfer is concerned, this data is consumed */
    *nread = 0;
    return CURLE_OK;
  }
  else {
    /* Fix up k->str to point just after the last RTP packet */
    k->str += *nread - rtp_dataleft;

    /* either all of the data has been read or...
     * rtp now points at the next byte to parse
     */
    if(rtp_dataleft > 0)
      DEBUGASSERT(k->str[0] == rtp[0]);

    DEBUGASSERT(rtp_dataleft <= *nread); /* sanity check */

    *nread = rtp_dataleft;
  }

  /* If we get here, we have finished with the leftover/merge buffer */
  Curl_safefree(rtspc->rtp_buf);
  rtspc->rtp_buf = NULL;
  rtspc->rtp_bufsize = 0;

  return CURLE_OK;
}